

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-util.c
# Opt level: O0

void player_resting_complete_special(player *p)

{
  _Bool _Var1;
  player *p_local;
  
  _Var1 = player_resting_is_special((int16_t)p->upkeep->resting);
  if (_Var1) {
    if (p->upkeep->resting == L'\xffffffff') {
      if ((p->chp == p->mhp) && (p->csp == p->msp)) {
        disturb(p);
      }
    }
    else if (p->upkeep->resting == L'\xfffffffe') {
      if (((((p->chp == p->mhp) &&
            (((p->csp == p->msp ||
              (_Var1 = flag_has_dbg((p->state).pflags,3,0x11,"p->state.pflags","(PF_COMBAT_REGEN)"),
              _Var1)) && (p->timed[2] == 0)))) &&
           (((p->timed[4] == 0 && (p->timed[7] == 0)) && (p->timed[5] == 0)))) &&
          ((p->timed[0x1c] == 0 && (p->timed[9] == 0)))) &&
         ((p->timed[8] == 0 &&
          ((((p->timed[1] == 0 && (p->timed[3] == 0)) && (p->timed[6] == 0)) &&
           ((p->word_recall == 0 && (p->deep_descent == 0)))))))) {
        disturb(p);
      }
    }
    else if ((p->upkeep->resting == L'\xfffffffd') && ((p->chp == p->mhp || (p->csp == p->msp)))) {
      disturb(p);
    }
  }
  return;
}

Assistant:

void player_resting_complete_special(struct player *p)
{
	/* Complete resting */
	if (!player_resting_is_special(p->upkeep->resting)) return;

	if (p->upkeep->resting == REST_ALL_POINTS) {
		if ((p->chp == p->mhp) && (p->csp == p->msp))
			/* Stop resting */
			disturb(p);
	} else if (p->upkeep->resting == REST_COMPLETE) {
		if ((p->chp == p->mhp) &&
			(p->csp == p->msp || player_has(p, PF_COMBAT_REGEN)) &&
			!p->timed[TMD_BLIND] && !p->timed[TMD_CONFUSED] &&
			!p->timed[TMD_POISONED] && !p->timed[TMD_AFRAID] &&
			!p->timed[TMD_TERROR] && !p->timed[TMD_STUN] &&
			!p->timed[TMD_CUT] && !p->timed[TMD_SLOW] &&
			!p->timed[TMD_PARALYZED] && !p->timed[TMD_IMAGE] &&
			!p->word_recall && !p->deep_descent)
			/* Stop resting */
			disturb(p);
	} else if (p->upkeep->resting == REST_SOME_POINTS) {
		if ((p->chp == p->mhp) || (p->csp == p->msp))
			/* Stop resting */
			disturb(p);
	}
}